

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O1

ndn_bitset_t
fwd_multicast(uint8_t *packet,size_t length,ndn_bitset_t out_faces,ndn_table_id_t in_face)

{
  ndn_face_table_t nVar1;
  uint uVar2;
  ndn_bitset_t nVar3;
  ulong uVar4;
  bool bVar5;
  
  if (out_faces == 0) {
    nVar3 = 0;
  }
  else {
    nVar3 = 0;
    do {
      uVar4 = -out_faces & out_faces;
      uVar2 = 0;
      if ((uint)uVar4 != 0) {
        for (; ((uint)uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      nVar1 = forwarder.facetab[(ulong)uVar2 + 1];
      if (nVar1 != (ndn_face_table_t)0x0 && uVar2 != in_face) {
        if (*(char *)((long)nVar1 + 0x22) != '\x01') {
          (**(code **)nVar1)(nVar1);
        }
        (**(code **)((long)nVar1 + 8))(nVar1,packet,length);
        nVar3 = nVar3 | 1L << ((ulong)uVar2 & 0x3f);
      }
      bVar5 = uVar4 != out_faces;
      out_faces = uVar4 ^ out_faces;
    } while (bVar5);
  }
  return nVar3;
}

Assistant:

static ndn_bitset_t
fwd_multicast(uint8_t* packet,
              size_t length,
              ndn_bitset_t out_faces,
              ndn_table_id_t in_face)
{
  ndn_table_id_t id;
  ndn_face_intf_t* face;
  ndn_bitset_t ret = 0;

  while(out_faces != 0){
    id = bitset_pop_least(&out_faces);
    face = forwarder.facetab->slots[id];
    if(id != in_face && face != NULL){
      ndn_face_send(face, packet, length);
      ret = bitset_set(ret, id);
    }
  }
  return ret;
}